

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateRowIndexDelete
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx,int iIdxNoSeek)

{
  ushort uVar1;
  long lVar2;
  Vdbe *p;
  ulong uVar3;
  int iVar4;
  int in_ECX;
  Table *in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  Index *pPk;
  Vdbe *v;
  Index *pPrior;
  Index *pIdx;
  int r1;
  int i;
  int iPartIdxLabel;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  Vdbe *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Parse *pIdx_00;
  Parse *pParse_00;
  Parse *pPrior_00;
  Parse *pPVar5;
  int local_3c;
  int local_38;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = -1;
  pPrior_00 = (Parse *)0x0;
  p = *(Vdbe **)(in_RDI + 0x10);
  if ((in_RSI->tabFlags & 0x80) == 0) {
    pIdx_00 = (Parse *)0x0;
  }
  else {
    pIdx_00 = (Parse *)sqlite3PrimaryKeyIndex(in_RSI);
  }
  local_38 = 0;
  pParse_00 = pIdx_00;
  for (pPVar5 = (Parse *)in_RSI->pIndex; pPVar5 != (Parse *)0x0;
      pPVar5 = *(Parse **)&pPVar5->mSubrtnSig) {
    if ((((in_R8 == 0) || (*(int *)(in_R8 + (long)local_38 * 4) != 0)) && (pPVar5 != pParse_00)) &&
       (in_ECX + local_38 != in_R9D)) {
      iVar4 = sqlite3GenerateIndexKey
                        (pParse_00,(Index *)pIdx_00,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                         (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (Index *)pPrior_00,(int)pPVar5);
      in_stack_ffffffffffffff90 = in_ECX + local_38;
      if ((*(ushort *)((long)&pPVar5->pIdxEpr + 3) >> 3 & 1) == 0) {
        uVar1 = *(ushort *)&pPVar5->pIdxEpr;
      }
      else {
        uVar1 = *(u16 *)((long)&pPVar5->pConstExpr + 6);
      }
      in_stack_ffffffffffffff84 = (uint)uVar1;
      in_stack_ffffffffffffff88 = p;
      in_stack_ffffffffffffff94 = iVar4;
      sqlite3VdbeAddOp3(p,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      sqlite3VdbeChangeP5(p,1);
      uVar3 = (ulong)pPrior_00 >> 0x20;
      pPrior_00 = pPVar5;
      sqlite3ResolvePartIdxLabel((Parse *)CONCAT44(in_stack_ffffffffffffff74,local_3c),(int)uVar3);
      pPVar5 = pPrior_00;
      local_3c = iVar4;
    }
    local_38 = local_38 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx,      /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
  int iIdxNoSeek     /* Do not delete from this cursor */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    if( iIdxCur+i==iIdxNoSeek ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
        &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
        pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3VdbeChangeP5(v, 1);  /* Cause IdxDelete to error if no entry found */
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}